

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modify_maximal_reconvergence.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ModifyMaximalReconvergence::AddMaximalReconvergence(ModifyMaximalReconvergence *this)

{
  _Type acVar1;
  long *plVar2;
  ModifyMaximalReconvergence *pMVar3;
  bool bVar4;
  int iVar5;
  uint32_t uVar6;
  IRContext *pIVar7;
  pointer *__ptr;
  Instruction *pIVar8;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_00;
  uint uVar9;
  FeatureManager *pFVar10;
  Module *pMVar11;
  Instruction *pIVar12;
  long lVar13;
  bool bVar14;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar15;
  uint32_t id;
  Instruction extension;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  entry_points_with_mode;
  array<signed_char,_4UL> local_1d4;
  Instruction *local_1d0;
  undefined8 local_1c8;
  ModifyMaximalReconvergence *local_1c0;
  int local_1b4 [3];
  undefined1 local_1a8 [24];
  undefined1 local_190 [8];
  undefined1 *local_188;
  undefined8 local_180;
  undefined4 local_178;
  undefined1 local_170 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_150;
  undefined1 local_148 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_128;
  Instruction *local_120;
  undefined1 local_118 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_f8;
  IRContext *local_f0;
  Instruction local_e8;
  initializer_list<spvtools::opt::Operand> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  pIVar7 = (this->super_Pass).context_;
  pFVar10 = (pIVar7->feature_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
            .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar10 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(pIVar7);
    pFVar10 = (pIVar7->feature_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
              .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  bVar4 = EnumSet<spv::Capability>::contains(&pFVar10->capabilities_,Shader);
  pIVar7 = (this->super_Pass).context_;
  pMVar11 = (pIVar7->module_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar8 = *(Instruction **)
            ((long)&(pMVar11->extensions_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  pIVar12 = (Instruction *)
            ((long)&(pMVar11->extensions_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  local_1c0 = this;
  if (pIVar8 == pIVar12) {
    bVar14 = false;
  }
  else {
    do {
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ =
           (Instruction *)0x0;
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = false;
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
           (_func_int **)&PTR__Instruction_003d7c30;
      local_e8.unique_id_ = pIVar8->unique_id_;
      local_e8.context_ = pIVar8->context_;
      local_e8.opcode_ = pIVar8->opcode_;
      local_e8.has_type_id_ = pIVar8->has_type_id_;
      local_e8.has_result_id_ = pIVar8->has_result_id_;
      local_e8._46_2_ = *(undefined2 *)&pIVar8->field_0x2e;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                (&local_e8.operands_,&pIVar8->operands_);
      std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::vector
                (&local_e8.dbg_line_insts_,&pIVar8->dbg_line_insts_);
      local_e8.dbg_scope_ = pIVar8->dbg_scope_;
      if (local_e8.operands_.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_e8.operands_.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
      }
      Operand::AsString_abi_cxx11_
                ((string *)local_1a8,
                 local_e8.operands_.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      iVar5 = std::__cxx11::string::compare((char *)local_1a8);
      bVar14 = iVar5 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1a8 + 0x10)) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      Instruction::~Instruction(&local_e8);
    } while ((iVar5 != 0) &&
            (pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_,
            pIVar8 != pIVar12));
    pIVar7 = (local_1c0->super_Pass).context_;
  }
  local_68._M_allocated_capacity = (size_type)&uStack_38;
  local_68._8_8_ = 1;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0x3f800000;
  local_40 = 0;
  uStack_38 = 0;
  pMVar11 = (pIVar7->module_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar12 = (Instruction *)
            ((long)&(pMVar11->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction> + 8)
  ;
  pIVar8 = *(Instruction **)
            ((long)&(pMVar11->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction> +
            0x10);
  if (pIVar8 != pIVar12) {
    do {
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ =
           (Instruction *)0x0;
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = false;
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
           (_func_int **)&PTR__Instruction_003d7c30;
      local_e8.unique_id_ = pIVar8->unique_id_;
      local_e8.context_ = pIVar8->context_;
      local_e8.opcode_ = pIVar8->opcode_;
      local_e8.has_type_id_ = pIVar8->has_type_id_;
      local_e8.has_result_id_ = pIVar8->has_result_id_;
      local_e8._46_2_ = *(undefined2 *)&pIVar8->field_0x2e;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                (&local_e8.operands_,&pIVar8->operands_);
      std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::vector
                (&local_e8.dbg_line_insts_,&pIVar8->dbg_line_insts_);
      local_e8.dbg_scope_ = pIVar8->dbg_scope_;
      uVar9 = (local_e8.has_result_id_ & 1) + 1;
      if (local_e8.has_type_id_ == false) {
        uVar9 = (uint)local_e8.has_result_id_;
      }
      uVar6 = Instruction::GetSingleWordOperand(&local_e8,uVar9 + 1);
      if (uVar6 == 0x1787) {
        uVar6 = (local_e8.has_result_id_ & 1) + 1;
        if (local_e8.has_type_id_ == false) {
          uVar6 = (uint)local_e8.has_result_id_;
        }
        uVar6 = Instruction::GetSingleWordOperand(&local_e8,uVar6);
        local_148._0_4_ = uVar6;
        local_1a8._0_8_ = &local_68;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_68,local_148,local_1a8);
      }
      Instruction::~Instruction(&local_e8);
      pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar8 != pIVar12);
    pMVar11 = (((local_1c0->super_Pass).context_)->module_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
              .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  }
  pIVar8 = *(Instruction **)
            ((long)&(pMVar11->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>.
                    sentinel_ + 8);
  pIVar12 = &(pMVar11->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  if (pIVar8 == pIVar12) {
    local_1c8 = 0;
  }
  else {
    local_1c8 = 0;
    local_120 = pIVar12;
    do {
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ =
           (Instruction *)0x0;
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = false;
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
           (_func_int **)&PTR__Instruction_003d7c30;
      local_e8.unique_id_ = pIVar8->unique_id_;
      local_e8.context_ = pIVar8->context_;
      local_e8.opcode_ = pIVar8->opcode_;
      local_e8.has_type_id_ = pIVar8->has_type_id_;
      local_e8.has_result_id_ = pIVar8->has_result_id_;
      local_e8._46_2_ = *(undefined2 *)&pIVar8->field_0x2e;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                (&local_e8.operands_,&pIVar8->operands_);
      std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::vector
                (&local_e8.dbg_line_insts_,&pIVar8->dbg_line_insts_);
      local_e8.dbg_scope_ = pIVar8->dbg_scope_;
      uVar9 = (local_e8.has_result_id_ & 1) + 1;
      if (local_e8.has_type_id_ == false) {
        uVar9 = (uint)local_e8.has_result_id_;
      }
      local_1d4._M_elems = (_Type)Instruction::GetSingleWordOperand(&local_e8,uVar9 + 1);
      pMVar3 = local_1c0;
      plVar2 = *(long **)(local_68._M_allocated_capacity +
                         ((ulong)(uint)local_1d4._M_elems % (ulong)local_68._8_8_) * 8);
      if (plVar2 != (long *)0x0) {
        plVar2 = (long *)*plVar2;
        acVar1 = *(_Type *)(plVar2 + 1);
        do {
          if (local_1d4._M_elems == acVar1) goto LAB_0025ea2c;
          plVar2 = (long *)*plVar2;
        } while ((plVar2 != (long *)0x0) &&
                (acVar1 = *(_Type *)(plVar2 + 1),
                (ulong)(uint)acVar1 % (ulong)local_68._8_8_ ==
                (ulong)(uint)local_1d4._M_elems % (ulong)local_68._8_8_));
      }
      if (!bVar14) {
        pIVar7 = (local_1c0->super_Pass).context_;
        local_1a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_1a8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"SPV_KHR_maximal_reconvergence","");
        IRContext::AddExtension(pIVar7,(string *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_1a8 + 0x10)) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
      }
      if (bVar4 == false) {
        IRContext::AddCapability((pMVar3->super_Pass).context_,Shader);
      }
      pIVar7 = (pMVar3->super_Pass).context_;
      local_1b4[2] = 0x10;
      local_1b4[1] = 0;
      local_1b4[0] = 0;
      local_148._0_8_ = &PTR__SmallVector_003d7c78;
      local_148._24_8_ = local_148 + 0x10;
      local_128._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      local_148[0x10] = local_1d4._M_elems[0];
      local_148[0x11] = local_1d4._M_elems[1];
      local_148[0x12] = local_1d4._M_elems[2];
      local_148[0x13] = local_1d4._M_elems[3];
      local_148._8_8_ = 1;
      local_1a8._0_4_ = 1;
      local_1a8._8_8_ = &PTR__SmallVector_003d7c78;
      local_1a8._16_8_ = 0;
      local_188 = local_190;
      local_180 = 0;
      local_f0 = pIVar7;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)(local_1a8 + 8),
                 (SmallVector<unsigned_int,_2UL> *)local_148);
      local_118._0_8_ = &PTR__SmallVector_003d7c78;
      local_118._24_8_ = local_118 + 0x10;
      local_f8._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      local_118[0x10] = -0x79;
      local_118[0x11] = '\x17';
      local_118[0x12] = '\0';
      local_118[0x13] = '\0';
      local_118._8_8_ = 1;
      local_178 = 0x10;
      local_170._0_8_ = &PTR__SmallVector_003d7c78;
      local_170._8_8_ = 0;
      local_170._24_8_ = local_170 + 0x10;
      local_150._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)local_170,
                 (SmallVector<unsigned_int,_2UL> *)local_118);
      local_78._M_array = (iterator)local_1a8;
      local_78._M_len = 2;
      MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
                ((spvtools *)&local_1d0,&local_f0,(Op *)(local_1b4 + 2),local_1b4 + 1,local_1b4,
                 &local_78);
      pIVar12 = local_1d0;
      local_1d0 = (Instruction *)0x0;
      utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                (&(((pIVar7->module_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                    .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                  execution_modes_).super_IntrusiveList<spvtools::opt::Instruction>,pIVar12);
      if (local_1d0 != (Instruction *)0x0) {
        (**(code **)(*(long *)local_1d0 + 8))();
      }
      pIVar12 = local_120;
      local_1d0 = (Instruction *)0x0;
      lVar13 = -0x60;
      this_00 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                &local_150;
      do {
        *(undefined ***)(this_00 + -0x20) = &PTR__SmallVector_003d7c78;
        if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00 !=
            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    (this_00,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00);
        }
        *(undefined8 *)this_00 = 0;
        this_00 = this_00 + -0x30;
        lVar13 = lVar13 + 0x30;
      } while (lVar13 != 0);
      local_118._0_8_ = &PTR__SmallVector_003d7c78;
      if (local_f8._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl !=
          (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_f8,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   local_f8._M_t.
                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   ._M_head_impl);
      }
      local_148._0_8_ = &PTR__SmallVector_003d7c78;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_128._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_128,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   local_128._M_t.
                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   ._M_head_impl);
      }
      local_1a8._0_8_ = &local_68;
      pVar15 = std::
               _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               ::
               _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                         ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                           *)local_1a8._0_8_,&local_1d4,local_1a8);
      bVar4 = true;
      bVar14 = true;
      local_1c8 = CONCAT71(pVar15.first.super__Node_iterator_base<unsigned_int,_false>._M_cur._1_7_,
                           1);
LAB_0025ea2c:
      Instruction::~Instruction(&local_e8);
      pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar8 != pIVar12);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_68);
  return (bool)((byte)local_1c8 & 1);
}

Assistant:

bool ModifyMaximalReconvergence::AddMaximalReconvergence() {
  bool changed = false;
  bool has_extension = false;
  bool has_shader =
      context()->get_feature_mgr()->HasCapability(spv::Capability::Shader);
  for (auto extension : context()->extensions()) {
    if (extension.GetOperand(0).AsString() == "SPV_KHR_maximal_reconvergence") {
      has_extension = true;
      break;
    }
  }

  std::unordered_set<uint32_t> entry_points_with_mode;
  for (auto mode : get_module()->execution_modes()) {
    if (spv::ExecutionMode(mode.GetSingleWordInOperand(1)) ==
        spv::ExecutionMode::MaximallyReconvergesKHR) {
      entry_points_with_mode.insert(mode.GetSingleWordInOperand(0));
    }
  }

  for (auto entry_point : get_module()->entry_points()) {
    const uint32_t id = entry_point.GetSingleWordInOperand(1);
    if (!entry_points_with_mode.count(id)) {
      changed = true;
      if (!has_extension) {
        context()->AddExtension("SPV_KHR_maximal_reconvergence");
        has_extension = true;
      }
      if (!has_shader) {
        context()->AddCapability(spv::Capability::Shader);
        has_shader = true;
      }
      context()->AddExecutionMode(MakeUnique<Instruction>(
          context(), spv::Op::OpExecutionMode, 0, 0,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {id}},
              {SPV_OPERAND_TYPE_EXECUTION_MODE,
               {static_cast<uint32_t>(
                   spv::ExecutionMode::MaximallyReconvergesKHR)}}}));
      entry_points_with_mode.insert(id);
    }
  }

  return changed;
}